

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Cast_x86_fma::forward(Cast_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _elempack;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  ulong uVar9;
  undefined1 auVar10 [32];
  unsigned_short uVar11;
  int iVar12;
  int iVar13;
  _func_int **pp_Var14;
  uint uVar15;
  uint uVar16;
  _func_int *p_Var17;
  void *pvVar18;
  int iVar19;
  size_t sVar20;
  undefined1 (*pauVar21) [16];
  void *pvVar22;
  undefined1 (*pauVar23) [16];
  int iVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [32];
  uint uVar29;
  long lVar30;
  long lVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  
  p_Var17 = this->_vptr_Cast_x86_fma[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var17) == *(int *)(&this->field_0xd4 + (long)p_Var17)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar13 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    iVar1 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar13;
    top_blob->h = iVar24;
    top_blob->d = iVar1;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar13 = bottom_blob->w;
  iVar24 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  uVar16 = bottom_blob->c;
  iVar19 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar20 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var17)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_fma + (long)p_Var17),bottom_blob,top_blob,
                    opt);
    }
    sVar20 = sVar20 * 4;
    break;
  case 2:
  case 4:
    sVar20 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar20 = bottom_blob->elemsize;
  }
  switch(iVar19) {
  case 1:
    Mat::create(top_blob,iVar13,sVar20,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar13,iVar24,sVar20,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar13,iVar24,uVar16,sVar20,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar13,iVar24,iVar1,uVar16,sVar20,_elempack,opt->blob_allocator);
  }
  auVar33 = in_ZMM3._0_16_;
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  pp_Var14 = this->_vptr_Cast_x86_fma;
  p_Var17 = pp_Var14[-3];
  iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var17);
  if (iVar19 == 1) {
    if ((*(int *)(&this->field_0xd4 + (long)p_Var17) == 2) &&
       (iVar19 = bottom_blob->c, 0 < (long)iVar19)) {
      uVar29 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      lVar31 = 0;
      do {
        pauVar28 = (undefined1 (*) [32])
                   (bottom_blob->cstep * lVar31 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar21 = (undefined1 (*) [16])
                   (top_blob->cstep * lVar31 * top_blob->elemsize + (long)top_blob->data);
        if ((int)uVar29 < 8) {
          uVar26 = 0;
        }
        else {
          iVar12 = 7;
          do {
            auVar33 = vcvtps2ph_f16c(*pauVar28,8);
            *pauVar21 = auVar33;
            pauVar28 = pauVar28 + 1;
            pauVar21 = pauVar21 + 1;
            iVar12 = iVar12 + 8;
            uVar26 = uVar29 & 0xfffffff8;
          } while (iVar12 < (int)uVar29);
        }
        uVar15 = uVar26 | 3;
        while ((int)uVar15 < (int)uVar29) {
          vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar28,8);
          pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
          pauVar21 = (undefined1 (*) [16])(*pauVar21 + 8);
          uVar15 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if (uVar29 - uVar26 != 0 && (int)uVar26 <= (int)uVar29) {
          lVar30 = 0;
          do {
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            uVar11 = float32_to_float16(*(float *)(*pauVar28 + lVar30 * 4));
            *(unsigned_short *)(*pauVar21 + lVar30 * 2) = uVar11;
            lVar30 = lVar30 + 1;
          } while (uVar29 - uVar26 != (int)lVar30);
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != iVar19);
      pp_Var14 = this->_vptr_Cast_x86_fma;
      p_Var17 = pp_Var14[-3];
      iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var17);
      goto LAB_00498f2a;
    }
  }
  else {
LAB_00498f2a:
    auVar33 = in_ZMM3._0_16_;
    if (iVar19 == 2) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var17) != 1) ||
         (iVar19 = bottom_blob->c, (long)iVar19 < 1)) goto LAB_004994bf;
      uVar29 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      lVar31 = 0;
      do {
        pauVar21 = (undefined1 (*) [16])
                   (bottom_blob->cstep * lVar31 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar28 = (undefined1 (*) [32])
                   (top_blob->cstep * lVar31 * top_blob->elemsize + (long)top_blob->data);
        if ((int)uVar29 < 8) {
          uVar26 = 0;
        }
        else {
          iVar12 = 7;
          do {
            auVar8 = vcvtph2ps_f16c(*pauVar21);
            *pauVar28 = auVar8;
            pauVar21 = pauVar21 + 1;
            pauVar28 = pauVar28 + 1;
            iVar12 = iVar12 + 8;
            uVar26 = uVar29 & 0xfffffff8;
          } while (iVar12 < (int)uVar29);
        }
        uVar15 = uVar26 | 3;
        while ((int)uVar15 < (int)uVar29) {
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *(ulong *)*pauVar21;
          auVar33 = vcvtph2ps_f16c(auVar33);
          *(undefined1 (*) [16])*pauVar28 = auVar33;
          pauVar21 = (undefined1 (*) [16])(*pauVar21 + 8);
          pauVar28 = (undefined1 (*) [32])(*pauVar28 + 0x10);
          uVar15 = uVar26 + 7;
          uVar26 = uVar26 + 4;
        }
        if (uVar29 - uVar26 != 0 && (int)uVar26 <= (int)uVar29) {
          lVar30 = 0;
          do {
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            fVar32 = float16_to_float32(*(unsigned_short *)(*pauVar21 + lVar30 * 2));
            *(float *)(*pauVar28 + lVar30 * 4) = fVar32;
            lVar30 = lVar30 + 1;
          } while (uVar29 - uVar26 != (int)lVar30);
        }
        auVar33 = in_ZMM3._0_16_;
        lVar31 = lVar31 + 1;
      } while (lVar31 != iVar19);
      pp_Var14 = this->_vptr_Cast_x86_fma;
      p_Var17 = pp_Var14[-3];
      iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var17);
    }
    if (iVar19 == 3) {
      if ((int)uVar16 < 1 || *(int *)(&this->field_0xd4 + (long)p_Var17) != 1) goto LAB_004994bf;
      uVar29 = iVar1 * _elempack * iVar24 * iVar13;
      pvVar18 = bottom_blob->data;
      sVar20 = bottom_blob->cstep;
      pvVar22 = top_blob->data;
      sVar3 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      sVar5 = bottom_blob->elemsize;
      uVar25 = 0;
      do {
        if (0 < (int)uVar29) {
          uVar27 = 0;
          do {
            *(float *)((long)pvVar22 + uVar27 * 4) = (float)(int)*(char *)((long)pvVar18 + uVar27);
            uVar27 = uVar27 + 1;
          } while (uVar29 != uVar27);
        }
        uVar25 = uVar25 + 1;
        pvVar22 = (void *)((long)pvVar22 + sVar3 * sVar4);
        pvVar18 = (void *)((long)pvVar18 + sVar20 * sVar5);
      } while (uVar25 != uVar16);
      p_Var17 = pp_Var14[-3];
      iVar19 = *(int *)(&this->field_0xd0 + (long)p_Var17);
    }
    if (iVar19 != 1) goto LAB_004994bf;
  }
  if (*(int *)(&this->field_0xd4 + (long)p_Var17) == 4) {
    iVar13 = cpu_support_x86_avx2();
    auVar10 = _DAT_00555120;
    auVar8 = _DAT_00555100;
    if (iVar13 == 0) {
      iVar13 = bottom_blob->c;
      if (0 < (long)iVar13) {
        uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar31 = 0;
        auVar34._8_8_ = 0x8000000000000000;
        auVar34._0_8_ = 0x8000000000000000;
        auVar33 = vpcmpeqd_avx(auVar33,auVar33);
        do {
          pauVar21 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar31 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar23 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar31 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar16 < 0x10) {
            uVar29 = 0;
          }
          else {
            iVar24 = 0xf;
            do {
              auVar35 = vpsrld_avx(*pauVar21,0x10);
              auVar36 = vpsrld_avx(pauVar21[1],0x10);
              auVar35 = vpackusdw_avx(auVar35,auVar36);
              auVar36 = vpsrld_avx(pauVar21[2],0x10);
              auVar37 = vpsrld_avx(pauVar21[3],0x10);
              auVar36 = vpackusdw_avx(auVar36,auVar37);
              pauVar23[1] = auVar36;
              *pauVar23 = auVar35;
              pauVar21 = pauVar21 + 4;
              pauVar23 = pauVar23 + 2;
              iVar24 = iVar24 + 0x10;
              uVar29 = uVar16 & 0xfffffff0;
            } while (iVar24 < (int)uVar16);
          }
          uVar26 = uVar29 | 7;
          while ((int)uVar26 < (int)uVar16) {
            auVar35 = vpsrld_avx(*pauVar21,0x10);
            auVar36 = vpsrld_avx(pauVar21[1],0x10);
            auVar35 = vpackusdw_avx(auVar35,auVar36);
            *pauVar23 = auVar35;
            pauVar21 = pauVar21 + 2;
            pauVar23 = pauVar23 + 1;
            uVar26 = uVar29 + 0xf;
            uVar29 = uVar29 + 8;
          }
          if ((int)uVar29 < (int)uVar16) {
            uVar25 = CONCAT44(0,~uVar29 + uVar16);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar25;
            auVar37 = vpshufd_avx(auVar35,0x44);
            auVar35 = vorps_avx(auVar37,auVar34);
            auVar36 = vorps_avx(auVar37,auVar34);
            auVar37 = vorps_avx(auVar37,auVar34);
            uVar27 = 0;
            do {
              auVar38._8_8_ = 0;
              auVar38._0_8_ = uVar27;
              auVar38 = vpshufd_avx(auVar38,0x44);
              auVar40._16_16_ = auVar38;
              auVar40._0_16_ = auVar38;
              auVar6 = vorps_avx(auVar40,auVar8);
              auVar40 = vorps_avx(auVar40,auVar10);
              auVar39._0_8_ = auVar40._16_8_ ^ 0x8000000000000000;
              auVar39._8_4_ = auVar40._24_4_;
              auVar39._12_4_ = auVar40._28_4_ ^ 0x80000000;
              auVar7 = vpcmpgtq_avx(auVar39,auVar35);
              uVar9 = auVar40._0_8_;
              auVar42._0_8_ = uVar9 ^ 0x8000000000000000;
              auVar41._8_4_ = auVar40._8_4_;
              auVar42._8_4_ = auVar41._8_4_;
              uVar29 = auVar40._12_4_;
              auVar42._12_4_ = uVar29 ^ 0x80000000;
              auVar38 = vpcmpgtq_avx(auVar42,auVar36);
              auVar38 = vpackssdw_avx(auVar38,auVar7);
              auVar44._0_8_ = auVar6._16_8_ ^ 0x8000000000000000;
              auVar44._8_4_ = auVar6._24_4_;
              auVar44._12_4_ = auVar6._28_4_ ^ 0x80000000;
              auVar42 = vpcmpgtq_avx(auVar44,auVar35);
              auVar47._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
              auVar46._8_4_ = auVar6._8_4_;
              auVar47._8_4_ = auVar46._8_4_;
              auVar47._12_4_ = auVar6._12_4_ ^ 0x80000000;
              auVar39 = vpcmpgtq_avx(auVar47,auVar37);
              auVar39 = vpackssdw_avx(auVar39,auVar42);
              auVar38 = vpackssdw_avx(auVar39 ^ auVar33,auVar38 ^ auVar33);
              auVar39 = vpmovsxwd_avx(auVar38);
              auVar44 = vpunpckhwd_avx(auVar38,auVar38);
              auVar43._16_16_ = auVar44;
              auVar43._0_16_ = auVar39;
              auVar40 = vmaskmovps_avx(auVar43,*(undefined1 (*) [32])(*pauVar21 + uVar27 * 4));
              if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar27 * 2) = auVar40._2_2_;
              }
              auVar46._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
              auVar46._12_4_ = auVar6._12_4_ ^ 0x80000000;
              auVar38 = vpcmpgtq_avx(auVar46,auVar37);
              auVar38 = vpackssdw_avx(auVar38,auVar38);
              auVar38 = vpackssdw_avx(auVar38 ^ auVar33,auVar38 ^ auVar33);
              if ((auVar38 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar27 * 2 + 2) = auVar40._6_2_;
              }
              auVar38 = vpackssdw_avx(auVar42,auVar42);
              auVar38 = vpackssdw_avx(auVar38 ^ auVar33,auVar38 ^ auVar33);
              if ((auVar38 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar27 * 2 + 4) = auVar40._10_2_;
              }
              auVar38 = vpackssdw_avx(auVar42,auVar42);
              auVar38 = vpackssdw_avx(auVar38 ^ auVar33,auVar38 ^ auVar33);
              if ((auVar38 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar27 * 2 + 6) = auVar40._14_2_;
              }
              auVar45._8_4_ = auVar41._8_4_;
              auVar45._0_8_ = uVar9 ^ 0x8000000000000000;
              auVar45._12_4_ = uVar29 ^ 0x80000000;
              auVar38 = vpcmpgtq_avx(auVar45,auVar36);
              auVar38 = vpackssdw_avx(auVar38,auVar38);
              auVar38 = vpackssdw_avx(auVar38 ^ auVar33,auVar38 ^ auVar33);
              if ((auVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar27 * 2 + 8) = auVar40._18_2_;
              }
              auVar41._0_8_ = uVar9 ^ 0x8000000000000000;
              auVar41._12_4_ = uVar29 ^ 0x80000000;
              auVar38 = vpcmpgtq_avx(auVar41,auVar36);
              auVar38 = vpackssdw_avx(auVar38,auVar38);
              auVar38 = vpackssdw_avx(auVar38 ^ auVar33,auVar38 ^ auVar33);
              if ((auVar38 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar27 * 2 + 10) = auVar40._22_2_;
              }
              auVar38 = vpackssdw_avx(auVar7,auVar7);
              auVar38 = vpackssdw_avx(auVar38 ^ auVar33,auVar38 ^ auVar33);
              if ((auVar38 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar27 * 2 + 0xc) = auVar40._26_2_;
              }
              auVar38 = vpackssdw_avx(auVar7,auVar7);
              auVar38 = vpackssdw_avx(auVar38 ^ auVar33,auVar38 ^ auVar33);
              if ((auVar38 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar23 + uVar27 * 2 + 0xe) = auVar40._30_2_;
              }
              uVar27 = uVar27 + 8;
            } while ((uVar25 + 8 & 0xfffffffffffffff8) != uVar27);
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != iVar13);
      }
    }
    else {
      cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
    }
  }
LAB_004994bf:
  if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_fma[-3]) == 4) &&
     (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_fma[-3]) == 1)) {
    iVar13 = cpu_support_x86_avx2();
    if (iVar13 == 0) {
      iVar13 = bottom_blob->c;
      if (0 < (long)iVar13) {
        uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
        lVar31 = 0;
        auVar33 = ZEXT816(0) << 0x40;
        do {
          pauVar21 = (undefined1 (*) [16])
                     (bottom_blob->cstep * lVar31 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar23 = (undefined1 (*) [16])
                     (top_blob->cstep * lVar31 * top_blob->elemsize + (long)top_blob->data);
          if ((int)uVar16 < 8) {
            uVar29 = 0;
          }
          else {
            iVar24 = 7;
            do {
              auVar35 = vpunpcklwd_avx(auVar33,*pauVar21);
              auVar34 = vpunpckhwd_avx(auVar33,*pauVar21);
              pauVar23[1] = auVar34;
              *pauVar23 = auVar35;
              pauVar21 = pauVar21 + 1;
              pauVar23 = pauVar23 + 2;
              iVar24 = iVar24 + 8;
              uVar29 = uVar16 & 0xfffffff8;
            } while (iVar24 < (int)uVar16);
          }
          uVar26 = uVar29 | 3;
          while ((int)uVar26 < (int)uVar16) {
            auVar36._8_8_ = 0;
            auVar36._0_8_ = *(ulong *)*pauVar21;
            auVar34 = vpunpcklwd_avx(auVar33,auVar36);
            *pauVar23 = auVar34;
            pauVar21 = (undefined1 (*) [16])(*pauVar21 + 8);
            pauVar23 = pauVar23 + 1;
            uVar26 = uVar29 + 7;
            uVar29 = uVar29 + 4;
          }
          if (uVar16 - uVar29 != 0 && (int)uVar29 <= (int)uVar16) {
            lVar30 = 0;
            do {
              *(uint *)(*pauVar23 + lVar30 * 4) = (uint)*(ushort *)(*pauVar21 + lVar30 * 2) << 0x10;
              lVar30 = lVar30 + 1;
            } while (uVar16 - uVar29 != (int)lVar30);
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != iVar13);
      }
    }
    else {
      cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
    }
  }
  return 0;
}

Assistant:

int Cast_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}